

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackFrame.c
# Opt level: O0

void sysbvm_stackFrame_prepareUnwinding(sysbvm_stackFrameRecord_t *targetRecord)

{
  sysbvm_context_t *context_00;
  long *in_FS_OFFSET;
  sysbvm_stackFrameCleanupRecord_t *cleanupRecord;
  sysbvm_stackFrameContinueTargetRecord_t *continueRecord;
  sysbvm_stackFrameBreakTargetRecord_t *breakRecord;
  sysbvm_stackFrameFunctionActivationRecord_t *activationRecord;
  sysbvm_context_t *context;
  sysbvm_stackFrameRecord_t *targetRecord_local;
  
  context_00 = (sysbvm_context_t *)in_FS_OFFSET[-3];
  in_FS_OFFSET[-2] = (long)targetRecord;
  switch(targetRecord->type) {
  case SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION:
    if (targetRecord[2].previous != (sysbvm_stackFrameRecord_s *)0x0) {
      sysbvm_analysisAndEvaluationEnvironment_clearUnwindingRecords
                (context_00,(sysbvm_tuple_t)targetRecord[2].previous);
    }
    break;
  default:
    break;
  case SYSBVM_STACK_FRAME_RECORD_TYPE_BREAK_TARGET:
    if (targetRecord[1].previous != (sysbvm_stackFrameRecord_s *)0x0) {
      sysbvm_analysisAndEvaluationEnvironment_clearUnwindingRecords
                (context_00,(sysbvm_tuple_t)targetRecord[1].previous);
    }
    break;
  case SYSBVM_STACK_FRAME_RECORD_TYPE_CONTINUE_TARGET:
    if (targetRecord[1].previous != (sysbvm_stackFrameRecord_s *)0x0) {
      sysbvm_analysisAndEvaluationEnvironment_clearUnwindingRecords
                (context_00,(sysbvm_tuple_t)targetRecord[1].previous);
    }
    break;
  case SYSBVM_STACK_FRAME_RECORD_TYPE_CLEANUP:
    if (targetRecord[1].previous != (sysbvm_stackFrameRecord_s *)0x0) {
      *(sysbvm_stackFrameRecord_s **)(*in_FS_OFFSET + -0x10) = targetRecord->previous;
      sysbvm_function_applyNoCheck0
                (*(sysbvm_context_t **)(*in_FS_OFFSET + -0x18),
                 (sysbvm_tuple_t)targetRecord[1].previous);
    }
  }
  return;
}

Assistant:

static void sysbvm_stackFrame_prepareUnwinding(sysbvm_stackFrameRecord_t *targetRecord)
{
    sysbvm_context_t *context = sysbvm_stackFrame_activeContext;
    sysbvm_stackFrame_activeRecord = targetRecord;

    switch(targetRecord->type)
    {
    case SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION:
        {
            sysbvm_stackFrameFunctionActivationRecord_t *activationRecord = (sysbvm_stackFrameFunctionActivationRecord_t*)targetRecord;
            if(activationRecord->applicationEnvironment)
                sysbvm_analysisAndEvaluationEnvironment_clearUnwindingRecords(context, activationRecord->applicationEnvironment);
        }
        break;
    case SYSBVM_STACK_FRAME_RECORD_TYPE_BREAK_TARGET:
        {
            sysbvm_stackFrameBreakTargetRecord_t *breakRecord = (sysbvm_stackFrameBreakTargetRecord_t*)targetRecord;
            if(breakRecord->environment)
                sysbvm_analysisAndEvaluationEnvironment_clearUnwindingRecords(context, breakRecord->environment);
        }
        break;
    case SYSBVM_STACK_FRAME_RECORD_TYPE_CONTINUE_TARGET:
        {
            sysbvm_stackFrameContinueTargetRecord_t *continueRecord = (sysbvm_stackFrameContinueTargetRecord_t*)targetRecord;
            if(continueRecord->environment)
                sysbvm_analysisAndEvaluationEnvironment_clearUnwindingRecords(context, continueRecord->environment);
        }
        break;
    case SYSBVM_STACK_FRAME_RECORD_TYPE_CLEANUP:
        {
            sysbvm_stackFrameCleanupRecord_t *cleanupRecord = (sysbvm_stackFrameCleanupRecord_t*)targetRecord;
            if(cleanupRecord->action)
            {
                sysbvm_stackFrame_activeRecord = targetRecord->previous;
                sysbvm_function_applyNoCheck0(sysbvm_stackFrame_activeContext, cleanupRecord->action);
            }
        }
        break;
    default:
        // Nothing special is required here.
        break;
    }
}